

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgIOHelpers.hpp
# Opt level: O0

void TasGrid::IO::writeVector<true,(TasGrid::IO::IOPad)1,int>
               (vector<int,_std::allocator<int>_> *x,ostream *os)

{
  int *piVar1;
  ostream *os_local;
  vector<int,_std::allocator<int>_> *x_local;
  
  piVar1 = ::std::vector<int,_std::allocator<int>_>::data(x);
  ::std::vector<int,_std::allocator<int>_>::size(x);
  ::std::ostream::write((char *)os,(long)piVar1);
  return;
}

Assistant:

void writeVector(const std::vector<VecType> &x, std::ostream &os){
    if (iomode == mode_ascii){
        if (pad == pad_lspace)
            for(auto i : x) os << " " << i;
        if (pad == pad_rspace)
            for(auto i : x) os << i << " ";
        if ((pad == pad_none) || (pad == pad_line)){
            os << x[0];
            for(size_t i = 1; i < x.size(); i++) os << " " << x[i];
            if (pad == pad_line) os << std::endl;
        }
    }else{
        os.write((char*) x.data(), x.size() * sizeof(VecType));
    }
}